

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::IdentityTessellationShaderCase::iterate
          (IdentityTessellationShaderCase *this)

{
  CaseType CVar1;
  TestLog *pTVar2;
  char *pcVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  ProgramSources *pPVar9;
  ostream *poVar10;
  RenderTarget *pRVar11;
  TestError *pTVar12;
  char *pcVar13;
  char *pcVar14;
  long lVar15;
  ContextType local_43c;
  VertexArray vao;
  ScopedLogSection section;
  undefined1 local_408 [8];
  _Alloc_hider _Stack_400;
  ProgramSources *local_3d8;
  undefined1 local_3d0 [40];
  Surface resultWithoutTessellation;
  Surface resultWithTessellation;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  anon_struct_64_4_50fb60c7 renderTargets [2];
  ostringstream buf;
  ProgramSources sources;
  long lVar8;
  
  iVar6 = (*((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  tcu::Surface::Surface(&resultWithTessellation,0x100,0x100);
  tcu::Surface::Surface(&resultWithoutTessellation,0x100,0x100);
  cVar4 = (this->m_case == CASE_TRIANGLES) + '\x02';
  renderTargets[0].name = "RenderWithTessellationShader";
  renderTargets[0].description = "Render with tessellation shader";
  renderTargets[0].containsTessellationShaders = true;
  tcu::Surface::getAccess(&renderTargets[0].surfaceAccess,&resultWithTessellation);
  renderTargets[1].name = "RenderWithoutTessellationShader";
  renderTargets[1].description = "Render without tessellation shader";
  renderTargets[1].containsTessellationShaders = false;
  tcu::Surface::getAccess(&renderTargets[1].surfaceAccess,&resultWithoutTessellation);
  (**(code **)(lVar8 + 0x1a00))(0,0,0x100,0x100);
  (**(code **)(lVar8 + 0x1c0))(0,0,0,0x3f800000);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"set viewport",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x225);
  (**(code **)(lVar8 + 0x5e0))(0xbe2);
  (**(code **)(lVar8 + 0x120))(0x302,1);
  (**(code **)(lVar8 + 0x100))(0x8006);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"set blend",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x22a);
  lVar15 = 0;
  do {
    if (lVar15 == 0x80) {
      pRVar11 = Context::getRenderTarget((this->super_IdentityShaderCase).super_TestCase.m_context);
      pTVar2 = ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
      if (pRVar11->m_numSamples < 2) {
        tcu::Surface::getAccess((PixelBufferAccess *)&buf,&resultWithoutTessellation);
        tcu::Surface::getAccess((PixelBufferAccess *)&sources,&resultWithTessellation);
        local_408 = (undefined1  [8])0x800000008;
        _Stack_400._M_p = (pointer)0xff00000008;
        vao.super_ObjectWrapper.m_gl = (Functions *)&DAT_100000001;
        vao.super_ObjectWrapper.m_traits._0_4_ = 0;
        bVar5 = tcu::intThresholdPositionDeviationCompare
                          (pTVar2,"ImageCompare","Image comparison",(ConstPixelBufferAccess *)&buf,
                           (ConstPixelBufferAccess *)&sources,(UVec4 *)local_408,(IVec3 *)&vao,true,
                           COMPARE_LOG_RESULT);
      }
      else {
        tcu::Surface::getAccess((PixelBufferAccess *)&buf,&resultWithoutTessellation);
        tcu::Surface::getAccess((PixelBufferAccess *)&sources,&resultWithTessellation);
        bVar5 = tcu::fuzzyCompare(pTVar2,"ImageCompare","Image comparison",
                                  (ConstPixelBufferAccess *)&buf,(ConstPixelBufferAccess *)&sources,
                                  0.03,COMPARE_LOG_RESULT);
      }
      if (bVar5 == false) {
        pcVar14 = "Image comparison failed";
      }
      else {
        pcVar14 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,(uint)(bVar5 == false),pcVar14);
      tcu::Surface::~Surface(&resultWithoutTessellation);
      tcu::Surface::~Surface(&resultWithTessellation);
      return STOP;
    }
    pTVar2 = ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,
               *(char **)((long)renderTargets[0].surfaceAccess.super_ConstPixelBufferAccess.m_size.
                                m_data + lVar15 + -0x20),(allocator<char> *)local_408);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sources,
               *(char **)((long)(&renderTargets[0].surfaceAccess.super_ConstPixelBufferAccess.m_size
                                + -2) + lVar15),(allocator<char> *)&vao);
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)&buf,(string *)&sources);
    std::__cxx11::string::~string((string *)&sources);
    std::__cxx11::string::~string((string *)&buf);
    memset(&sources,0,0xac);
    sources.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sources.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    sources.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    sources.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    sources._193_8_ = 0;
    Functional::(anonymous_namespace)::IdentityShaderCase::getVertexSource_abi_cxx11_
              (&local_378,this);
    glu::VertexSource::VertexSource((VertexSource *)local_408,&local_378);
    pPVar9 = glu::ProgramSources::operator<<(&sources,(ShaderSource *)local_408);
    Functional::(anonymous_namespace)::IdentityShaderCase::getFragmentSource_abi_cxx11_
              (&local_338,this);
    glu::FragmentSource::FragmentSource((FragmentSource *)&vao,&local_338);
    local_3d8 = glu::ProgramSources::operator<<(pPVar9,(ShaderSource *)&vao);
    pcVar14 = "v_vertex_color";
    if (*(char *)((long)renderTargets[0].surfaceAccess.super_ConstPixelBufferAccess.m_size.m_data +
                 lVar15 + -0x10) != '\0') {
      pcVar14 = "v_evaluated_color";
    }
    CVar1 = this->m_case;
    pcVar3 = "basic-mode-drawElements-triangle_strip";
    if (CVar1 == CASE_ISOLINES) {
      pcVar3 = "basic-mode-drawElements-line_strip";
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
    poVar10 = std::operator<<((ostream *)&buf,"${VERSION_DECL}\n${EXTENSION_GEOMETRY_SHADER}layout("
                             );
    pcVar13 = "triangles";
    if (CVar1 == CASE_ISOLINES) {
      pcVar13 = "lines";
    }
    poVar10 = std::operator<<(poVar10,pcVar13);
    poVar10 = std::operator<<(poVar10,") in;\nlayout(");
    poVar10 = std::operator<<(poVar10,pcVar3 + 0x18);
    poVar10 = std::operator<<(poVar10,", max_vertices=");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,(uint)(CVar1 == CASE_ISOLINES) * 3 + 8);
    poVar10 = std::operator<<(poVar10,") out;\n\nin highp vec4 ");
    poVar10 = std::operator<<(poVar10,pcVar14);
    std::operator<<(poVar10,"[];\nout highp vec4 v_fragment_color;\n\nvoid main (void)\n{\n");
    if (this->m_case == CASE_ISOLINES) {
      poVar10 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                "\tvec4 mdir = vec4(gl_in[0].gl_Position.y - gl_in[1].gl_Position.y, gl_in[1].gl_Position.x - gl_in[0].gl_Position.x, 0.0, 0.0);\n\tfor (int i = 0; i <= 10; ++i)\n\t{\n\t\tfloat xweight = cos(float(i) / 10.0 * 6.28) * 0.5 + 0.5;\n\t\tfloat mweight = sin(float(i) / 10.0 * 6.28) * 0.1 + 0.1;\n\t\tgl_Position = mix(gl_in[0].gl_Position, gl_in[1].gl_Position, xweight) + mweight * mdir;\n\t\tv_fragment_color = mix("
                               );
      poVar10 = std::operator<<(poVar10,pcVar14);
      poVar10 = std::operator<<(poVar10,"[0], ");
      poVar10 = std::operator<<(poVar10,pcVar14);
      pcVar14 = "[1], xweight);\n\t\tEmitVertex();\n\t}\n";
LAB_01317c4a:
      std::operator<<(poVar10,pcVar14);
    }
    else if (this->m_case == CASE_TRIANGLES) {
      poVar10 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                                "\tvec4 centerPos = (gl_in[0].gl_Position + gl_in[1].gl_Position + gl_in[2].gl_Position) / 3.0f;\n\n\tfor (int ndx = 0; ndx < 4; ++ndx)\n\t{\n\t\tgl_Position = centerPos + (centerPos - gl_in[ndx % 3].gl_Position);\n\t\tv_fragment_color = "
                               );
      poVar10 = std::operator<<(poVar10,pcVar14);
      poVar10 = std::operator<<(poVar10,
                                "[ndx % 3];\n\t\tEmitVertex();\n\n\t\tgl_Position = centerPos + 0.7 * (centerPos - gl_in[ndx % 3].gl_Position);\n\t\tv_fragment_color = "
                               );
      poVar10 = std::operator<<(poVar10,pcVar14);
      pcVar14 = "[ndx % 3];\n\t\tEmitVertex();\n\t}\n";
      goto LAB_01317c4a;
    }
    std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
    std::__cxx11::stringbuf::str();
    local_43c.super_ApiType.m_bits =
         (ApiType)(*((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx->
                    _vptr_RenderContext[2])();
    specializeShader(&local_318,&local_358,&local_43c);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
    glu::GeometrySource::GeometrySource((GeometrySource *)local_3d0,&local_318);
    glu::ProgramSources::operator<<(local_3d8,(ShaderSource *)local_3d0);
    std::__cxx11::string::~string((string *)(local_3d0 + 8));
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&vao.super_ObjectWrapper.m_traits);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&_Stack_400);
    std::__cxx11::string::~string((string *)&local_378);
    if (*(char *)((long)renderTargets[0].surfaceAccess.super_ConstPixelBufferAccess.m_size.m_data +
                 lVar15 + -0x10) == '\x01') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
      poVar10 = std::operator<<((ostream *)&buf,
                                "${VERSION_DECL}\n${EXTENSION_TESSELATION_SHADER}layout(vertices = "
                               );
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,(this->m_case == CASE_TRIANGLES) + 2);
      std::operator<<(poVar10,
                      ") out;\n\nin highp vec4 v_vertex_color[];\nout highp vec4 v_control_color[];\n\nvoid main (void)\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n\tv_control_color[gl_InvocationID] = v_vertex_color[gl_InvocationID];\n\n"
                     );
      pcVar14 = "\tgl_TessLevelOuter[0] = 1.0;\n\tgl_TessLevelOuter[1] = 1.0;\n";
      if (this->m_case == CASE_ISOLINES) {
LAB_01317d9c:
        std::operator<<((ostream *)&buf,pcVar14);
      }
      else if (this->m_case == CASE_TRIANGLES) {
        pcVar14 = 
        "\tgl_TessLevelOuter[0] = 1.0;\n\tgl_TessLevelOuter[1] = 1.0;\n\tgl_TessLevelOuter[2] = 1.0;\n\tgl_TessLevelInner[0] = 1.0;\n"
        ;
        goto LAB_01317d9c;
      }
      std::operator<<((ostream *)&buf,"}\n");
      std::__cxx11::stringbuf::str();
      local_3d0._0_4_ =
           (*((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx->
             _vptr_RenderContext[2])();
      specializeShader(&local_358,(string *)&vao,(ContextType *)local_3d0);
      std::__cxx11::string::~string((string *)&vao);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
      glu::TessellationControlSource::TessellationControlSource
                ((TessellationControlSource *)local_408,&local_358);
      pPVar9 = glu::ProgramSources::operator<<(&sources,(ShaderSource *)local_408);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
      poVar10 = std::operator<<((ostream *)&buf,
                                "${VERSION_DECL}\n${EXTENSION_TESSELATION_SHADER}layout(");
      pcVar14 = "isolines";
      if (this->m_case == CASE_TRIANGLES) {
        pcVar14 = "triangles";
      }
      poVar10 = std::operator<<(poVar10,pcVar14);
      std::operator<<(poVar10,
                      ") in;\n\nin highp vec4 v_control_color[];\nout highp vec4 v_evaluated_color;\n\n// note: No need to use precise gl_Position since we do not require gapless geometry\nvoid main (void)\n{\n"
                     );
      pcVar14 = 
      "\tgl_Position = mix(gl_in[0].gl_Position, gl_in[1].gl_Position, gl_TessCoord.x);\n\tv_evaluated_color = mix(v_control_color[0], v_control_color[1], gl_TessCoord.x);\n"
      ;
      if (this->m_case == CASE_ISOLINES) {
LAB_01317e8b:
        std::operator<<((ostream *)&buf,pcVar14);
      }
      else if (this->m_case == CASE_TRIANGLES) {
        pcVar14 = 
        "\tgl_Position = gl_TessCoord.x * gl_in[0].gl_Position + gl_TessCoord.y * gl_in[1].gl_Position + gl_TessCoord.z * gl_in[2].gl_Position;\n\tv_evaluated_color = gl_TessCoord.x * v_control_color[0] + gl_TessCoord.y * v_control_color[1] + gl_TessCoord.z * v_control_color[2];\n"
        ;
        goto LAB_01317e8b;
      }
      std::operator<<((ostream *)&buf,"}\n");
      std::__cxx11::stringbuf::str();
      local_338._M_dataplus._M_p._0_4_ =
           (*((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx->
             _vptr_RenderContext[2])();
      specializeShader(&local_378,(string *)local_3d0,(ContextType *)&local_338);
      std::__cxx11::string::~string((string *)local_3d0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
      glu::TessellationEvaluationSource::TessellationEvaluationSource
                ((TessellationEvaluationSource *)&vao,&local_378);
      glu::ProgramSources::operator<<(pPVar9,(ShaderSource *)&vao);
      std::__cxx11::string::~string((string *)&vao.super_ObjectWrapper.m_traits);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&_Stack_400);
      std::__cxx11::string::~string((string *)&local_358);
    }
    glu::ShaderProgram::ShaderProgram
              ((ShaderProgram *)&buf,
               ((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx,&sources);
    glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
              (&vao,((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx);
    iVar6 = (**(code **)(lVar8 + 0x780))
                      (buf.super_basic_ostream<char,_std::char_traits<char>_>._152_4_,"a_position");
    glu::operator<<(((this->super_IdentityShaderCase).super_TestCase.super_TestCase.super_TestNode.
                    m_testCtx)->m_log,(ShaderProgram *)&buf);
    if (buf.super_basic_ostream<char,_std::char_traits<char>_>._192_1_ == '\0') {
      pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_408,"could not build program",(allocator<char> *)local_3d0);
      tcu::TestError::TestError(pTVar12,(string *)local_408);
      __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if (iVar6 == -1) {
      pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_408,"a_position location was -1",(allocator<char> *)local_3d0);
      tcu::TestError::TestError(pTVar12,(string *)local_408);
      __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar8 + 0xd8))(vao.super_ObjectWrapper.m_object);
    (**(code **)(lVar8 + 0x40))(0x8892,this->m_dataBuffer);
    (**(code **)(lVar8 + 0x19f0))(iVar6,4,0x1406,0,0,0);
    (**(code **)(lVar8 + 0x610))(iVar6);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"setup attribs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x24a);
    (**(code **)(lVar8 + 0x1680))(buf.super_basic_ostream<char,_std::char_traits<char>_>._152_4_);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"use program",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x24d);
    (**(code **)(lVar8 + 0x188))(0x4000);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"clear",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x250);
    if (*(char *)((long)renderTargets[0].surfaceAccess.super_ConstPixelBufferAccess.m_size.m_data +
                 lVar15 + -0x10) == '\x01') {
      (**(code **)(lVar8 + 0xfd8))(0x8e72,cVar4);
      dVar7 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar7,"set patch param",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                      ,0x255);
      (**(code **)(lVar8 + 0x538))(0xe,0,cVar4);
      dVar7 = (**(code **)(lVar8 + 0x800))();
      iVar6 = 600;
      pcVar14 = "draw patches";
    }
    else {
      (**(code **)(lVar8 + 0x538))((this->m_case == CASE_TRIANGLES) * '\x03' + '\x01',0,cVar4);
      dVar7 = (**(code **)(lVar8 + 0x800))();
      iVar6 = 0x25d;
      pcVar14 = "draw primitives";
    }
    glu::checkError(dVar7,pcVar14,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,iVar6);
    glu::readPixels(((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx,0,0,
                    (PixelBufferAccess *)
                    ((long)renderTargets[0].surfaceAccess.super_ConstPixelBufferAccess.m_size.m_data
                    + lVar15 + -8));
    glu::ObjectWrapper::~ObjectWrapper(&vao.super_ObjectWrapper);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&buf);
    glu::ProgramSources::~ProgramSources(&sources);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    lVar15 = lVar15 + 0x40;
  } while( true );
}

Assistant:

IdentityTessellationShaderCase::IterateResult IdentityTessellationShaderCase::iterate (void)
{
	const glw::Functions&	gl							= m_context.getRenderContext().getFunctions();
	tcu::Surface			resultWithTessellation		(RENDER_SIZE, RENDER_SIZE);
	tcu::Surface			resultWithoutTessellation	(RENDER_SIZE, RENDER_SIZE);
	const int				numPrimitiveVertices		= (m_case == CASE_TRIANGLES) ? (3) : (2);

	const struct
	{
		const char*				name;
		const char*				description;
		bool					containsTessellationShaders;
		tcu::PixelBufferAccess	surfaceAccess;
	} renderTargets[] =
	{
		{ "RenderWithTessellationShader",		"Render with tessellation shader",		true,	resultWithTessellation.getAccess()		},
		{ "RenderWithoutTessellationShader",	"Render without tessellation shader",	false,	resultWithoutTessellation.getAccess()	},
	};

	gl.viewport(0, 0, RENDER_SIZE, RENDER_SIZE);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "set viewport");

	gl.enable(GL_BLEND);
	gl.blendFunc(GL_SRC_ALPHA, GL_ONE);
	gl.blendEquation(GL_FUNC_ADD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "set blend");

	// render with and without tessellation shader
	for (int renderNdx = 0; renderNdx < DE_LENGTH_OF_ARRAY(renderTargets); ++renderNdx)
	{
		const tcu::ScopedLogSection	section	(m_testCtx.getLog(), renderTargets[renderNdx].name, renderTargets[renderNdx].description);
		glu::ProgramSources			sources;

		sources	<< glu::VertexSource(getVertexSource())
				<< glu::FragmentSource(getFragmentSource())
				<< glu::GeometrySource(getGeometrySource(renderTargets[renderNdx].containsTessellationShaders));

		if (renderTargets[renderNdx].containsTessellationShaders)
			sources	<< glu::TessellationControlSource(getTessellationControlSource())
					<< glu::TessellationEvaluationSource(getTessellationEvaluationSource());

		{
			const glu::ShaderProgram	program					(m_context.getRenderContext(), sources);
			const glu::VertexArray		vao						(m_context.getRenderContext());
			const int					posLocation				= gl.getAttribLocation(program.getProgram(), "a_position");

			m_testCtx.getLog() << program;

			if (!program.isOk())
				throw tcu::TestError("could not build program");
			if (posLocation == -1)
				throw tcu::TestError("a_position location was -1");

			gl.bindVertexArray(*vao);
			gl.bindBuffer(GL_ARRAY_BUFFER, m_dataBuffer);
			gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
			gl.enableVertexAttribArray(posLocation);
			GLU_EXPECT_NO_ERROR(gl.getError(), "setup attribs");

			gl.useProgram(program.getProgram());
			GLU_EXPECT_NO_ERROR(gl.getError(), "use program");

			gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

			if (renderTargets[renderNdx].containsTessellationShaders)
			{
				gl.patchParameteri(GL_PATCH_VERTICES, numPrimitiveVertices);
				GLU_EXPECT_NO_ERROR(gl.getError(), "set patch param");

				gl.drawArrays(GL_PATCHES, 0, numPrimitiveVertices);
				GLU_EXPECT_NO_ERROR(gl.getError(), "draw patches");
			}
			else
			{
				gl.drawArrays((m_case == CASE_TRIANGLES) ? (GL_TRIANGLES) : (GL_LINES), 0, numPrimitiveVertices);
				GLU_EXPECT_NO_ERROR(gl.getError(), "draw primitives");
			}

			glu::readPixels(m_context.getRenderContext(), 0, 0, renderTargets[renderNdx].surfaceAccess);
		}
	}

	// compare
	{
		bool imageOk;

		if (m_context.getRenderTarget().getNumSamples() > 1)
			imageOk = tcu::fuzzyCompare(m_testCtx.getLog(),
										"ImageCompare",
										"Image comparison",
										resultWithoutTessellation.getAccess(),
										resultWithTessellation.getAccess(),
										0.03f,
										tcu::COMPARE_LOG_RESULT);
		else
			imageOk = tcu::intThresholdPositionDeviationCompare(m_testCtx.getLog(),
																"ImageCompare",
																"Image comparison",
																resultWithoutTessellation.getAccess(),
																resultWithTessellation.getAccess(),
																tcu::UVec4(8, 8, 8, 255),				//!< threshold
																tcu::IVec3(1, 1, 0),					//!< 3x3 search kernel
																true,									//!< fragments may end up over the viewport, just ignore them
																tcu::COMPARE_LOG_RESULT);

		if (imageOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	}

	return STOP;
}